

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall fmt::v6::detail::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  boundaries bVar1;
  undefined8 extraout_RDX;
  fp fVar2;
  bool local_81;
  undefined1 local_78 [8];
  fp lower;
  fp local_58;
  significand_type local_48;
  fp upper;
  significand_type half_ulp;
  int min_normal_e;
  double d_local;
  fp *this_local;
  
  assign<double,_0>(this,d);
  upper.e = 0x10000000;
  upper._12_4_ = 0;
  if (this->e < -0xb2) {
    upper._8_8_ = 0x10000000L << (0x4eU - (char)this->e & 0x3f);
  }
  fp(&local_58,this->f + upper._8_8_,this->e);
  fVar2.f = (ulong)(uint)local_58.e;
  fVar2._8_8_ = extraout_RDX;
  fVar2 = normalize<0>((detail *)local_58.f,fVar2);
  lower._8_8_ = fVar2.f;
  upper.f._0_4_ = fVar2.e;
  local_81 = false;
  if (this->f == 0x10000000000000) {
    local_81 = -0xb2 < this->e;
  }
  local_48 = lower._8_8_;
  fp((fp *)local_78,this->f - ((ulong)upper._8_8_ >> local_81),this->e);
  bVar1.upper = local_48;
  bVar1.lower = (long)local_78 << ((char)lower.f - (char)(int)upper.f & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }